

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Rep *pRVar2;
  Type *value;
  size_t size;
  int i;
  void **elements;
  int n;
  RepeatedPtrFieldBase *this_local;
  
  if ((this->rep_ != (Rep *)0x0) && (this->arena_ == (Arena *)0x0)) {
    iVar1 = this->rep_->allocated_size;
    pRVar2 = this->rep_;
    for (size._4_4_ = 0; size._4_4_ < iVar1; size._4_4_ = size._4_4_ + 1) {
      value = cast<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                        (pRVar2->elements[size._4_4_]);
      GenericTypeHandler<CoreML::Specification::FeatureDescription>::Delete(value,(Arena *)0x0);
    }
    operator_delete(this->rep_,(long)this->total_size_ * 8 + 8);
  }
  this->rep_ = (Rep *)0x0;
  return;
}

Assistant:

void RepeatedPtrFieldBase::Destroy() {
  if (rep_ != NULL && arena_ == NULL) {
    int n = rep_->allocated_size;
    void* const* elements = rep_->elements;
    for (int i = 0; i < n; i++) {
      TypeHandler::Delete(cast<TypeHandler>(elements[i]), NULL);
    }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
    const size_t size = total_size_ * sizeof(elements[0]) + kRepHeaderSize;
    ::operator delete(static_cast<void*>(rep_), size);
#else
    ::operator delete(static_cast<void*>(rep_));
#endif
  }
  rep_ = NULL;
}